

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O1

MSize lj_ccallback_ptr2slot(CTState *cts,void *p)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (long)p - (long)(cts->cb).mcode;
  if ((0xfff < uVar3) ||
     (iVar1 = (int)uVar3, uVar2 = (iVar1 - 8U) / 0x8c,
     uVar2 = uVar2 * 0x20 + ((uVar2 * -0x8c + iVar1) - 8 >> 2),
     (uVar2 >> 5) * 0xc + uVar2 * 4 + 8 != iVar1)) {
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

MSize lj_ccallback_ptr2slot(CTState *cts, void *p)
{
  uintptr_t ofs = (uintptr_t)((uint8_t *)p -(uint8_t *)cts->cb.mcode);
  if (ofs < CALLBACK_MCODE_SIZE) {
    MSize slot = CALLBACK_OFS2SLOT((MSize)ofs);
    if (CALLBACK_SLOT2OFS(slot) == (MSize)ofs)
      return slot;
  }
  return ~0u;  /* Not a known callback function pointer. */
}